

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_TransferPointer
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  int selector;
  int flags;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  char *pcVar8;
  int toSlot;
  bool bVar9;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003c856a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003c855a:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003c856a:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x35f,
                  "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar6 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar6 == (AActor *)0x0) goto LAB_003c846f;
    pPVar4 = (pAVar6->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (pAVar6->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar9 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar9) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003c856a;
    }
  }
  else {
    if (pAVar6 != (AActor *)0x0) goto LAB_003c855a;
LAB_003c846f:
    pAVar6 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
LAB_003c8592:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x360,
                  "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003c8592;
  }
  if (numparam < 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_003c85ba:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x361,
                  "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003c85ba;
  }
  if (numparam == 3) {
    pcVar8 = "(paramnum) < numparam";
LAB_003c85e2:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x362,
                  "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar8 = "param[paramnum].Type == REGT_INT";
    goto LAB_003c85e2;
  }
  pVVar1 = param + 1;
  iVar3 = param[2].field_0.i;
  selector = param[3].field_0.i;
  if ((uint)numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003c860a;
    }
    toSlot = param[4].field_0.i;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003c860a:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x363,
                    "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    toSlot = param[4].field_0.i;
    if (numparam != 5) {
      if (param[5].field_0.field_3.Type == '\0') goto LAB_003c8500;
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003c8629;
    }
    param = defaultparam->Array;
  }
  if (param[5].field_0.field_3.Type == '\0') {
LAB_003c8500:
    flags = param[5].field_0.i;
    pAVar5 = COPY_AAPTR(pAVar6,(pVVar1->field_0).i);
    pAVar6 = COPY_AAPTR(pAVar6,iVar3);
    if (pAVar6 != (AActor *)0x0) {
      pAVar7 = COPY_AAPTR(pAVar5,selector);
      pAVar5 = (AActor *)0x0;
      if (pAVar7 != pAVar6) {
        pAVar5 = pAVar7;
      }
      if (toSlot == 0) {
        toSlot = selector;
      }
      ASSIGN_AAPTR(pAVar6,toSlot,pAVar5,flags);
    }
    return 0;
  }
  pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003c8629:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x364,
                "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_TransferPointer)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(ptr_source);
	PARAM_INT		(ptr_recipient);
	PARAM_INT		(ptr_sourcefield);
	PARAM_INT_DEF	(ptr_recipientfield);
	PARAM_INT_DEF	(flags);

	AActor *source, *recipient;

	// Exchange pointers with actors to whom you have pointers (or with yourself, if you must)
	source = COPY_AAPTR(self, ptr_source);
	recipient = COPY_AAPTR(self, ptr_recipient);	// pick an actor to store the provided pointer value
	if (recipient == NULL)
	{
		return 0;
	}

	// convert source from dataprovider to data
	source = COPY_AAPTR(source, ptr_sourcefield);
	if (source == recipient)
	{ // The recepient should not acquire a pointer to itself; will write NULL}
		source = NULL;
	}
	if (ptr_recipientfield == AAPTR_DEFAULT)
	{ // If default: Write to same field as data was read from
		ptr_recipientfield = ptr_sourcefield;
	}
	ASSIGN_AAPTR(recipient, ptr_recipientfield, source, flags);
	return 0;
}